

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O2

void PatchHandleArchipelago::add_proc_init_archipelago_ground_items(ROM *rom)

{
  uint32_t address;
  Code *code;
  Param local_138;
  undefined1 local_130;
  undefined1 local_128 [24];
  undefined3 uStack_110;
  undefined5 uStack_10d;
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_e0;
  Code func;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::cmpib(&func,0xc0,(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"regular_item_entity",(allocator<char> *)&local_138);
  md::Code::bcc(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::cmpib(&func,'X',(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"not_an_item",(allocator<char> *)&local_138);
  md::Code::bne(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x2000b;
  md::Code::moveb(&func,'#',(Param *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20036;
  md::Code::moveb(&func,'\x7f',(Param *)local_128);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::clrw(&func,(Param *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x02';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x2fffe;
  local_130 = 2;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::moveb(&func,(Param *)local_128,&local_138);
  local_128[8] = '\x02';
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::andib(&func,'\x03',(Param *)local_128);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::lslw(&func,'\b',(DataRegister *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x02';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20001;
  local_130 = 2;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  md::Code::moveb(&func,(Param *)local_128,&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"not_zero",(allocator<char> *)&local_138);
  md::Code::bne(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_128[8] = 2;
  local_128._0_8_ = &PTR_getXn_00246bf0;
  md::Code::movew(&func,2,(Param *)local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"not_zero",(allocator<char> *)&local_138);
  md::Code::label(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_130 = 2;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20034;
  md::Code::movew(&func,&local_138,(Param *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = '\x01';
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20025;
  md::Code::moveb(&func,'\x1c',(Param *)local_128);
  local_128._0_8_ = &PTR_getXn_00246d28;
  local_128[0x10] = 1;
  local_128._8_8_ = &PTR_getXn_00246c60;
  uStack_110 = 0x20027;
  md::Code::moveb(&func,'\x1c',(Param *)local_128);
  md::Code::jmp(&func,0x196fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"not_an_item",(allocator<char> *)&local_138);
  md::Code::label(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  md::Code::jmp(&func,0x1972a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"regular_item_entity",(allocator<char> *)&local_138);
  md::Code::label(&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  md::Code::jmp(&func,0x19638);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"",(allocator<char> *)&local_138);
  address = md::ROM::inject_code(rom,&func,(string *)local_128);
  std::__cxx11::string::~string((string *)local_128);
  local_108._M_left = &local_108;
  _Stack_e0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8 = 0;
  _Stack_e0._0_8_ = 0;
  local_108._M_color = _S_red;
  local_108._4_4_ = 0;
  local_108._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _uStack_110 = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0.super__Rb_tree_header._M_header._M_left = &_Stack_e0.super__Rb_tree_header._M_header;
  _Stack_e0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0.super__Rb_tree_header._M_node_count = 0;
  local_108._M_right = local_108._M_left;
  _Stack_e0.super__Rb_tree_header._M_header._M_right =
       _Stack_e0.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_128,address);
  md::ROM::set_code(rom,0x19630,code);
  md::Code::~Code((Code *)local_128);
  md::Code::~Code(&func);
  return;
}

Assistant:

static void add_proc_init_archipelago_ground_items(md::ROM& rom)
    {
        md::Code func;
        {
            func.cmpib(0xC0, reg_D0);
            func.bcc("regular_item_entity");
            {
                func.cmpib(ENTITY_ARCHIPELAGO_ITEM, reg_D0);
                func.bne("not_an_item");
                {
                    func.moveb(0x23, addr_(reg_A1, 0x0B));
                    func.moveb(ITEM_ARCHIPELAGO, addr_(reg_A1, 0x36));  // Contents value

                    // Apply custom behavior, or 0x0002 if none was specified
                    func.clrw(reg_D2);
                    func.moveb(addr_(reg_A2, 0xFFFE), reg_D2);
                    func.andib(0x03, reg_D2);
                    func.lslw(0x08, reg_D2);
                    func.moveb(addr_(reg_A2, 0x01), reg_D2);
                    func.bne("not_zero");
                    {
                        func.movew(0x0002, reg_D2);
                    }
                    func.label("not_zero");
                    func.movew(reg_D2, addr_(reg_A1, 0x34));

                    func.moveb(0x1C, addr_(reg_A1, 0x25));              // Sprite (animation)
                    func.moveb(0x1C, addr_(reg_A1, 0x27));              // Sprite (frame)
                    func.jmp(0x196FA);
                }
                func.label("not_an_item");
                func.jmp(0x1972A);
            }
            func.label("regular_item_entity");
            func.jmp(0x19638);
        }

        uint32_t func_addr = rom.inject_code(func);
        rom.set_code(0x19630, md::Code().jmp(func_addr));
    }